

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall
BailOutRecord::AdjustOffsetsForDiagMode
          (BailOutRecord *this,JavascriptCallStackLayout *layout,ScriptFunction *function)

{
  uint uVar1;
  int iVar2;
  GlobalBailOutRecordDataTable *pGVar3;
  GlobalBailOutRecordDataRow *pGVar4;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  FunctionBody *this_00;
  undefined4 *puVar8;
  FunctionEntryPointInfo *pFVar9;
  char *pcVar10;
  uint i;
  ulong uVar11;
  long lVar12;
  int local_34;
  
  this_00 = Js::JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x324,"(functionBody != nullptr)","functionBody != nullptr");
    if (!bVar6) goto LAB_003e2edb;
    *puVar8 = 0;
  }
  bVar6 = Js::FunctionProxy::IsInDebugMode((FunctionProxy *)this_00);
  if (!bVar6) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x326,"(functionBody->IsInDebugMode())","functionBody->IsInDebugMode()");
    if (!bVar6) goto LAB_003e2edb;
    *puVar8 = 0;
  }
  pFVar9 = Js::FunctionBody::GetDefaultFunctionEntryPointInfo(this_00);
  if (pFVar9 == (FunctionEntryPointInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x329,"(entryPointInfo != nullptr)","entryPointInfo != nullptr");
    if (!bVar6) goto LAB_003e2edb;
    *puVar8 = 0;
  }
  if (pFVar9->localVarChangedOffset != -1) {
    uVar7 = Js::FunctionBody::GetNonTempLocalVarCount(this_00);
    if (uVar7 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x32e,"(functionBody->GetNonTempLocalVarCount() != 0)",
                         "functionBody->GetNonTempLocalVarCount() != 0");
      if (!bVar6) {
LAB_003e2edb:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar8 = 0;
    }
    pcVar10 = Js::JavascriptCallStackLayout::GetValueChangeOffset
                        (layout,pFVar9->localVarChangedOffset);
    if (*pcVar10 == '\x01') {
      pGVar3 = this->globalBailOutRecordTable;
      uVar1 = this->m_bailOutRecordId;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      lVar12 = 0;
      for (uVar11 = 0; uVar11 < pGVar3->length; uVar11 = uVar11 + 1) {
        pGVar4 = pGVar3->globalBailOutRecordDataRows;
        if (uVar1 <= *(uint *)((long)&pGVar4->end + lVar12)) {
          if (uVar1 < *(uint *)((long)&pGVar4->start + lVar12)) {
            return;
          }
          iVar2 = *(int *)((long)&pGVar4->offset + lVar12);
          if (iVar2 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x339,"(offset != 0)","offset != 0");
            if (!bVar6) goto LAB_003e2edb;
            *puVar8 = 0;
          }
          bVar6 = Js::FunctionBody::GetSlotOffset
                            (this_00,*(uint *)(&pGVar4->field_0xc + lVar12) & 0x3fffffff,&local_34,
                             false);
          if (bVar6) {
            local_34 = local_34 + pFVar9->localVarSlotsOffset;
            if ((iVar2 < 1) && (iVar2 != local_34)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x33f,"(offset > 0 || offset == slotOffset)",
                                 "offset > 0 || offset == slotOffset");
              if (!bVar6) goto LAB_003e2edb;
              *puVar8 = 0;
            }
            *(int *)((long)&pGVar4->offset + lVar12) = local_34;
          }
        }
        lVar12 = lVar12 + 0x10;
      }
    }
  }
  return;
}

Assistant:

void
BailOutRecord::AdjustOffsetsForDiagMode(Js::JavascriptCallStackLayout * layout, Js::ScriptFunction * function) const
{
    // In this function we are going to do
    // 1. Check if the value got changed (by checking at the particular location at the stack)
    // 2. In that case update the offset to point to the stack offset

    Js::FunctionBody *functionBody =  function->GetFunctionBody();
    Assert(functionBody != nullptr);

    Assert(functionBody->IsInDebugMode());

    Js::FunctionEntryPointInfo *entryPointInfo = functionBody->GetDefaultFunctionEntryPointInfo();
    Assert(entryPointInfo != nullptr);

    // Note: the offset may be not initialized/InvalidOffset when there are no non-temp local vars.
    if (entryPointInfo->localVarChangedOffset != Js::Constants::InvalidOffset)
    {
        Assert(functionBody->GetNonTempLocalVarCount() != 0);

        char * valueChangeOffset = layout->GetValueChangeOffset(entryPointInfo->localVarChangedOffset);
        if (*valueChangeOffset == Js::FunctionBody::LocalsChangeDirtyValue)
        {
            // The value got changed due to debugger, lets read values from the stack position
            // Get the corresponding offset on the stack related to the frame.

            globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
                int32 offset = row->offset;
                // offset is zero, is it possible that a locals is not living in the debug mode?
                Assert(offset != 0);
                int32 slotOffset;
                if (functionBody->GetSlotOffset(row->regSlot, &slotOffset))
                {
                    slotOffset = entryPointInfo->localVarSlotsOffset + slotOffset;
                    // If it was taken from the stack location, we should have arrived to the same stack location.
                    Assert(offset > 0 || offset == slotOffset);
                    row->offset = slotOffset;
                }
            });
        }
    }
}